

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  long *plVar5;
  _func_int **pp_Var6;
  int iVar7;
  undefined8 uVar8;
  element_type *peVar9;
  buffer *pbVar10;
  long lVar11;
  long in_RDX;
  undefined **ppuVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  char *pcVar13;
  undefined1 auVar14 [16];
  ptr<resp_msg> pVar15;
  string local_50;
  
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  uVar8 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  peVar9 = (element_type *)operator_new(0xb0);
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar9->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001cf278;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar9->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar9->bg_append_thread_)._M_id._M_thread = 0xb;
  *(undefined4 *)((long)&(peVar9->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar9->bg_append_ea_ = uVar1;
  ppuVar12 = &PTR__resp_msg_001cf2c8;
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001cf2c8;
  peVar9->initialized_ = (atomic<bool>)(char)uVar8;
  *(int3 *)&peVar9->field_0x31 = (int3)((ulong)uVar8 >> 8);
  peVar9->leader_ = (atomic<int>)(int)((ulong)uVar8 >> 0x20);
  peVar9->id_ = 0;
  peVar9->my_priority_ = 0;
  *(undefined1 *)&peVar9->target_priority_ = 0;
  (peVar9->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->votes_responded_ = 0;
  peVar9->votes_granted_ = 0;
  (peVar9->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar9->priority_change_timer_).first_event_fired_ = 0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar9->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar9->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar9->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  psVar4 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar4 != (pointer)0x0) {
    iVar7 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar12 = (undefined **)extraout_RDX;
    if (4 < iVar7) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar13 = "false";
      if (((ulong)req[2].log_entries_.
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
        pcVar13 = "true";
      }
      msg_if_given_abi_cxx11_
                (&local_50,"entries size %d, type %d, catching_up %s\n",
                 (ulong)(*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38)) >> 4,
                 (ulong)*(byte *)(**(long **)(in_RDX + 0x38) + 8),pcVar13);
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_log_sync_req",0x142,&local_50);
      ppuVar12 = (undefined **)extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        ppuVar12 = (undefined **)extraout_RDX_01;
      }
    }
  }
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) == '\x04')) {
    if (((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
      plVar5 = *(long **)&req[9].super_msg_base.type_;
      lVar11 = *(long *)(in_RDX + 0x28);
      pbVar10 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
      (**(code **)(*plVar5 + 0x68))(plVar5,lVar11 + 1,pbVar10);
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar4 != (pointer)0x0) {
        iVar7 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (4 < iVar7) {
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar11 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
          msg_if_given_abi_cxx11_(&local_50,"last log %lu",lVar11 + -1);
          (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar4,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_log_sync_req",0x152,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      lVar11 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      LOCK();
      req[1].log_entries_.
      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar11 + -1);
      UNLOCK();
      lVar11 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      commit((raft_server *)req,lVar11 - 1);
      pp_Var6 = this->_vptr_raft_server;
      auVar14 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      ppuVar12 = auVar14._8_8_;
      pp_Var6[4] = auVar14._0_8_;
      *(undefined1 *)(pp_Var6 + 6) = 1;
      goto LAB_001857c1;
    }
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_001857c1;
    iVar7 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar12 = (undefined **)extraout_RDX_05;
    if (iVar7 < 3) goto LAB_001857c1;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_50,"This server is ready for cluster, ignore the request, my next log idx %lu"
               ,this->_vptr_raft_server[4]);
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
      ,"handle_log_sync_req",0x14d,&local_50);
    ppuVar12 = (undefined **)extraout_RDX_06;
  }
  else {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_001857c1;
    iVar7 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar12 = (undefined **)extraout_RDX_02;
    if (iVar7 < 3) goto LAB_001857c1;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_50,
               "receive an invalid LogSyncRequest as the log entry value doesn\'t meet the requirements: entries size %zu"
               ,*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4);
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
      ,"handle_log_sync_req",0x147,&local_50);
    ppuVar12 = (undefined **)extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    ppuVar12 = (undefined **)extraout_RDX_04;
  }
LAB_001857c1:
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar12;
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( state_->get_term(), msg_type::sync_log_response, id_,
            req.get_src(), log_store_->next_slot() ) );

    p_db("entries size %d, type %d, catching_up %s\n",
         (int)entries.size(), (int)entries[0]->get_val_type(),
         (catching_up_)?"true":"false");
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::log_pack ) {
        p_wn("receive an invalid LogSyncRequest as the log entry value "
             "doesn't meet the requirements: entries size %zu",
             entries.size() );
        return resp;
    }

    if (!catching_up_) {
        p_wn("This server is ready for cluster, ignore the request, "
             "my next log idx %" PRIu64 "", resp->get_next_idx());
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    p_db("last log %" PRIu64, log_store_->next_slot() - 1);
    precommit_index_ = log_store_->next_slot() - 1;
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}